

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O1

void av1_ml_predict_breakout
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,uint pb_source_variance,int bit_depth
               ,PartitionSearchState *part_state)

{
  float fVar1;
  BLOCK_SIZE BVar2;
  byte bVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  long lVar7;
  NN_CONFIG *pNVar8;
  float features [4];
  float score;
  aom_partition_features_t features_1;
  int in_stack_ffffffffffffd478;
  int in_stack_ffffffffffffd480;
  float local_2b78;
  float fStack_2b74;
  float fStack_2b70;
  float fStack_2b6c;
  aom_partition_decision_t local_2b5c;
  aom_partition_features_t local_b18;
  
  BVar2 = (part_state->part_blk_params).bsize;
  bVar3 = 1;
  pNVar8 = (NN_CONFIG *)0x0;
  iVar6 = 0;
  switch(BVar2) {
  case BLOCK_16X16:
    pNVar8 = &av1_partition_breakout_nnconfig_16;
    lVar7 = 0x60980;
    break;
  case BLOCK_16X32:
  case BLOCK_32X16:
  case BLOCK_32X64:
  case BLOCK_64X32:
  case BLOCK_64X128:
  case BLOCK_128X64:
    goto switchD_001eef7e_caseD_7;
  case BLOCK_32X32:
    pNVar8 = &av1_partition_breakout_nnconfig_32;
    lVar7 = 0x60984;
    break;
  case BLOCK_64X64:
    pNVar8 = &av1_partition_breakout_nnconfig_64;
    lVar7 = 0x60988;
    break;
  case BLOCK_128X128:
    pNVar8 = &av1_partition_breakout_nnconfig_128;
    lVar7 = 0x6098c;
    break;
  default:
    iVar6 = 0;
    if (BVar2 != BLOCK_8X8) goto switchD_001eef7e_caseD_7;
    pNVar8 = &av1_partition_breakout_nnconfig_8;
    lVar7 = 0x6097c;
  }
  iVar6 = *(int *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar7);
  bVar3 = 0;
switchD_001eef7e_caseD_7:
  if (!(bool)(iVar6 < 0 | bVar3)) {
    fVar1 = *(float *)("" + (long)(cpi->sf).part_sf.ml_predict_breakout_level * 4 + 0x14);
    local_2b78 = (((float)x->rdmult * 0.0078125 * 0.001953125) /
                 (float)(1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[BVar2] &
                              0x1f))) * (float)rd_stats->rate;
    lVar7 = 0x7fffffff;
    if (rd_stats->dist < 0x7fffffff) {
      lVar7 = rd_stats->dist;
    }
    fStack_2b74 = (float)(lVar7 >> ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                                    [BVar2] & 0x3f));
    fStack_2b70 = (float)pb_source_variance;
    iVar5 = (int)*x->plane[0].dequant_QTX >> ((char)bit_depth - 8U & 0x1f);
    fStack_2b6c = (float)(iVar5 * iVar5) * 0.00390625;
    write_features_to_file
              ((cpi->oxcf).partition_info_path,(cpi->ext_part_controller).test_mode != 0,&local_2b78
               ,4,2,(BLOCK_SIZE)&local_2b78,in_stack_ffffffffffffd478,in_stack_ffffffffffffd480);
    if ((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
       ((cpi->ext_part_controller).ready != 0)) {
      local_b18.id = AOM_EXT_PART_FEATURE_AFTER_NONE;
      local_b18.after_part_none.f[1] = fStack_2b74;
      local_b18.after_part_none.f[0] = local_2b78;
      local_b18.after_part_none.f[3] = fStack_2b6c;
      local_b18.after_part_none.f[2] = fStack_2b70;
      av1_ext_part_send_features(&cpi->ext_part_controller,&local_b18);
      _Var4 = av1_ext_part_get_partition_decision(&cpi->ext_part_controller,&local_2b5c);
      if (_Var4) {
        part_state->do_rectangular_split = local_2b5c.do_rectangular_split;
        part_state->do_square_split = local_2b5c.do_square_split;
        return;
      }
    }
    local_2b5c.is_final_decision = 0;
    (*av1_nn_predict)(&local_2b78,pNVar8,1,(float *)&local_2b5c);
    if ((int)((float)iVar6 * fVar1) <= (int)((float)local_2b5c.is_final_decision * 100.0)) {
      part_state->do_rectangular_split = 0;
      part_state->do_square_split = 0;
    }
  }
  return;
}

Assistant:

void av1_ml_predict_breakout(AV1_COMP *const cpi, const MACROBLOCK *const x,
                             const RD_STATS *const rd_stats,
                             unsigned int pb_source_variance, int bit_depth,
                             PartitionSearchState *part_state) {
  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const int mi_row = blk_params->mi_row, mi_col = blk_params->mi_col;
  const BLOCK_SIZE bsize = blk_params->bsize;

  const NN_CONFIG *nn_config = NULL;
  int thresh = 0;
  switch (bsize) {
    case BLOCK_8X8:
      nn_config = &av1_partition_breakout_nnconfig_8;
      thresh = cpi->sf.part_sf.ml_partition_search_breakout_thresh[0];
      break;
    case BLOCK_16X16:
      nn_config = &av1_partition_breakout_nnconfig_16;
      thresh = cpi->sf.part_sf.ml_partition_search_breakout_thresh[1];
      break;
    case BLOCK_32X32:
      nn_config = &av1_partition_breakout_nnconfig_32;
      thresh = cpi->sf.part_sf.ml_partition_search_breakout_thresh[2];
      break;
    case BLOCK_64X64:
      nn_config = &av1_partition_breakout_nnconfig_64;
      thresh = cpi->sf.part_sf.ml_partition_search_breakout_thresh[3];
      break;
    case BLOCK_128X128:
      nn_config = &av1_partition_breakout_nnconfig_128;
      thresh = cpi->sf.part_sf.ml_partition_search_breakout_thresh[4];
      break;
    default: assert(0 && "Unexpected bsize.");
  }
  if (!nn_config || thresh < 0) return;

  const float ml_predict_breakout_thresh_scale[3] = { 1.15f, 1.05f, 1.0f };
  thresh = (int)((float)thresh *
                 ml_predict_breakout_thresh_scale
                     [cpi->sf.part_sf.ml_predict_breakout_level - 1]);

  // Generate feature values.
  float features[FEATURES];
  int feature_index = 0;

  const int num_pels_log2 = num_pels_log2_lookup[bsize];
  float rate_f = (float)AOMMIN(rd_stats->rate, INT_MAX);
  rate_f = ((float)x->rdmult / 128.0f / 512.0f / (float)(1 << num_pels_log2)) *
           rate_f;
  features[feature_index++] = rate_f;

  const float dist_f =
      (float)(AOMMIN(rd_stats->dist, INT_MAX) >> num_pels_log2);
  features[feature_index++] = dist_f;

  features[feature_index++] = (float)pb_source_variance;

  const int dc_q = (int)x->plane[0].dequant_QTX[0] >> (bit_depth - 8);
  features[feature_index++] = (float)(dc_q * dc_q) / 256.0f;
  assert(feature_index == FEATURES);

  // Write features to file
  write_features_to_file(cpi->oxcf.partition_info_path,
                         cpi->ext_part_controller.test_mode, features, FEATURES,
                         2, bsize, mi_row, mi_col);

  if (ext_ml_model_decision_after_none(&cpi->ext_part_controller,
                                       frame_is_intra_only(&cpi->common),
                                       features, &part_state->do_square_split,
                                       &part_state->do_rectangular_split)) {
    return;
  }

  // Calculate score using the NN model.
  float score = 0.0f;
  av1_nn_predict(features, nn_config, 1, &score);

  // Make decision.
  if ((int)(score * 100) >= thresh) {
    part_state->do_square_split = 0;
    part_state->do_rectangular_split = 0;
  }
}